

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawFlow
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          Iterator it,QList<QTextFrame_*> *floats,QTextBlock *cursorBlockNeedingRepaint)

{
  double dVar1;
  QAbstractTextDocumentLayout *this_00;
  QTextFrame *frame;
  int iVar2;
  int iVar3;
  uint objectType;
  QTextFrame *pQVar4;
  QTextObjectInterface *pQVar5;
  QCheckPoint *pQVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  QTextDocumentLayoutPrivate *this_01;
  PaintContext *pPVar12;
  QTextFrame *c;
  long in_FS_OFFSET;
  bool bVar13;
  byte bVar14;
  PaintContext pc;
  bool local_10c;
  QCheckPoint *local_108;
  qsizetype *local_f8;
  QCheckPoint **local_e0;
  undefined1 local_a8 [16];
  PaintContext local_98;
  QTextBlock local_48;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  if (((it.cf == (QTextFrame *)0x0) && (it.cb == it.e)) || (it.f == (QTextFrame *)0x0)) {
    local_108 = (this->checkPoints).d.ptr + (this->checkPoints).d.size;
  }
  else {
    pQVar4 = QTextFrame::parentFrame(it.f);
    pQVar6 = (this->checkPoints).d.ptr;
    uVar8 = (this->checkPoints).d.size;
    local_108 = pQVar6 + uVar8;
    if (pQVar4 == (QTextFrame *)0x0) {
      local_10c = true;
      bVar13 = true;
      if (((0.0 < (context->clip).w) && (dVar1 = (context->clip).h, 0.0 < dVar1)) &&
         (local_108 = pQVar6, bVar13 = local_10c, 0 < (long)uVar8)) {
        do {
          uVar9 = uVar8 >> 1;
          uVar10 = uVar9;
          if (pQVar6[uVar9].y.val < (int)((dVar1 + (context->clip).yp) * 64.0)) {
            uVar10 = ~uVar9 + uVar8;
            pQVar6 = pQVar6 + uVar9 + 1;
          }
          uVar8 = uVar10;
          local_108 = pQVar6;
        } while (0 < (long)uVar10);
      }
      goto LAB_004e470e;
    }
  }
  local_10c = false;
  bVar13 = local_10c;
LAB_004e470e:
  local_10c = bVar13;
  local_e0 = &(this->checkPoints).d.ptr;
  local_f8 = &(this->checkPoints).d.size;
  local_48.p = (QTextDocumentPrivate *)0x0;
  local_48.n = 0;
  local_48._12_4_ = 0xaaaaaaaa;
  bVar13 = it.cf == (QTextFrame *)0x0;
  if ((!bVar13) || (it.cb != it.e)) {
    pQVar4 = (QTextFrame *)0x0;
    do {
      frame = it.cf;
      if ((local_10c != false) && (*local_f8 != 0)) {
        if (bVar13) {
          QTextFrame::iterator::currentBlock(&it);
          iVar2 = QTextBlock::position((QTextBlock *)&local_98);
        }
        else {
          iVar2 = QTextFrame::firstPosition(it.cf);
        }
        if (((*local_e0)[*local_f8 + -1].positionInFrame <= iVar2) ||
           ((((local_108 != *local_e0 + *local_f8 && (0.0 < (context->clip).w)) &&
             (0.0 < (context->clip).h)) && (local_108->positionInFrame <= iVar2)))) break;
      }
      if (bVar13) {
        puVar11 = &DAT_006ac5b8;
        pPVar12 = &local_98;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined8 *)pPVar12 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
          pPVar12 = (PaintContext *)((long)pPVar12 + (ulong)bVar14 * -0x10 + 8);
        }
        local_98.cursorPosition = context->cursorPosition;
        QPalette::QPalette(&local_98.palette,&context->palette);
        local_98.clip.xp = (context->clip).xp;
        local_98.clip.yp = (context->clip).yp;
        local_98.clip.w = (context->clip).w;
        local_98.clip.h = (context->clip).h;
        local_98.selections.d.d = (context->selections).d.d;
        local_98.selections.d.ptr = (context->selections).d.ptr;
        local_98.selections.d.size = (context->selections).d.size;
        if (local_98.selections.d.d != (Data *)0x0) {
          LOCK();
          ((local_98.selections.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               = ((local_98.selections.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QTextFrame::iterator::currentBlock(&it);
        lVar7 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (((lVar7 != 0) && (bVar13 = QTextBlock::isValid((QTextBlock *)local_a8), bVar13)) &&
           (iVar2 = QTextBlock::length((QTextBlock *)local_a8), iVar2 == 1)) {
          iVar2 = QTextFrame::lastPosition(pQVar4);
          iVar3 = QTextBlock::position((QTextBlock *)local_a8);
          if (iVar2 == iVar3 + -1) {
            QList<QAbstractTextDocumentLayout::Selection>::clear(&local_98.selections);
          }
        }
        QTextFrame::iterator::currentBlock(&it);
        drawBlock(this,offset,painter,&local_98,(QTextBlock *)local_a8,local_10c);
        QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::~QArrayDataPointer
                  (&local_98.selections.d);
        QPalette::~QPalette(&local_98.palette);
      }
      else {
        drawFrame(this,offset,painter,context,frame);
      }
      QTextBlock::blockFormat((QTextBlock *)&local_98);
      if (((it.cf == (QTextFrame *)0x0) && (it.cb == it.e)) ||
         (((lVar7 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject), lVar7 == 0 ||
           (((bVar13 = QTextBlock::isValid(&local_48), !bVar13 ||
             (iVar2 = QTextBlock::length(&local_48), iVar2 != 1)) ||
            (bVar13 = QTextFormat::hasProperty((QTextFormat *)&local_98,0x1060), bVar13)))) ||
          (bVar13 = QTextFormat::hasProperty((QTextFormat *)&local_98,0x820), bVar13)))) {
LAB_004e4a31:
        QTextFormat::~QTextFormat((QTextFormat *)&local_98);
      }
      else {
        iVar2 = QTextFrame::firstPosition(it.cf);
        iVar3 = QTextBlock::position(&local_48);
        if (iVar2 != iVar3 + 1) goto LAB_004e4a31;
        bVar13 = QTextBlock::contains(&local_48,context->cursorPosition);
        QTextFormat::~QTextFormat((QTextFormat *)&local_98);
        if (bVar13) {
          cursorBlockNeedingRepaint->p = local_48.p;
          cursorBlockNeedingRepaint->n = local_48.n;
        }
      }
      QTextFrame::iterator::currentBlock(&it);
      local_48.p = (QTextDocumentPrivate *)CONCAT44(local_98._4_4_,local_98.cursorPosition);
      local_48.n = (int)local_98.palette.d;
      QTextFrame::iterator::operator++(&it);
      bVar13 = it.cf == (QTextFrame *)0x0;
      pQVar4 = frame;
    } while ((!bVar13) || (it.cb != it.e));
  }
  if ((floats->d).size != 0) {
    uVar8 = 0;
    do {
      pQVar4 = (floats->d).ptr[uVar8];
      iVar2 = QTextFrame::firstPosition(pQVar4);
      iVar3 = QTextFrame::lastPosition(pQVar4);
      if (iVar3 < iVar2) {
        QTextFrame::frameFormat((QTextFrame *)&local_98);
        iVar2 = QTextFormat::intProperty((QTextFormat *)&local_98,0x800);
        QTextFormat::~QTextFormat((QTextFormat *)&local_98);
        if (iVar2 != 0) {
          iVar2 = QTextFrame::firstPosition(pQVar4);
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractTextDocumentLayout::format((QAbstractTextDocumentLayout *)local_a8,(int)this_00);
          objectType = QTextFormat::intProperty((QTextFormat *)local_a8,0x2f00);
          this_01 = (QTextDocumentLayoutPrivate *)(ulong)objectType;
          pQVar5 = QAbstractTextDocumentLayout::handlerForObject(this_00,objectType);
          if (pQVar5 != (QTextObjectInterface *)0x0) {
            local_98.palette.currentGroup = ~Active;
            local_98.palette._12_4_ = 0xffffffff;
            local_98.clip.xp = -NAN;
            local_98.cursorPosition = -1;
            local_98._4_4_ = 0xffffffff;
            local_98.palette.d._0_4_ = -1;
            local_98.palette.d._4_4_ = 0xffffffff;
            frameBoundingRectInternal((QRectF *)&local_98,this_01,pQVar4);
            (*pQVar5->_vptr_QTextObjectInterface[3])
                      (pQVar5,painter,&local_98,
                       (this->super_QAbstractTextDocumentLayoutPrivate).document,(ulong)(iVar2 - 1),
                       (QTextFormat *)local_a8);
          }
          QTextFormat::~QTextFormat((QTextFormat *)local_a8);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(floats->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFlow(const QPointF &offset, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &context,
                                          QTextFrame::Iterator it, const QList<QTextFrame *> &floats, QTextBlock *cursorBlockNeedingRepaint) const
{
    Q_Q(const QTextDocumentLayout);
    const bool inRootFrame = (!it.atEnd() && it.parentFrame() && it.parentFrame()->parentFrame() == nullptr);

    auto lastVisibleCheckPoint = checkPoints.end();
    if (inRootFrame && context.clip.isValid()) {
        lastVisibleCheckPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), QFixed::fromReal(context.clip.bottom()));
    }

    QTextBlock previousBlock;
    QTextFrame *previousFrame = nullptr;

    for (; !it.atEnd(); ++it) {
        QTextFrame *c = it.currentFrame();

        if (inRootFrame && !checkPoints.isEmpty()) {
            int currentPosInDoc;
            if (c)
                currentPosInDoc = c->firstPosition();
            else
                currentPosInDoc = it.currentBlock().position();

            // if we're past what is already laid out then we're better off
            // not trying to draw things that may not be positioned correctly yet
            if (currentPosInDoc >= checkPoints.constLast().positionInFrame)
                break;

            if (lastVisibleCheckPoint != checkPoints.end()
                && context.clip.isValid()
                && currentPosInDoc >= lastVisibleCheckPoint->positionInFrame
               )
                break;
        }

        if (c)
            drawFrame(offset, painter, context, c);
        else {
            QAbstractTextDocumentLayout::PaintContext pc = context;
            if (isEmptyBlockAfterTable(it.currentBlock(), previousFrame))
                pc.selections.clear();
            drawBlock(offset, painter, pc, it.currentBlock(), inRootFrame);
        }

        // when entering a table and the previous block is empty
        // then layoutFlow 'hides' the block that just causes a
        // new line by positioning it /on/ the table border. as we
        // draw that block before the table itself the decoration
        // 'overpaints' the cursor and we need to paint it afterwards
        // again
        if (isEmptyBlockBeforeTable(previousBlock, previousBlock.blockFormat(), it)
            && previousBlock.contains(context.cursorPosition)
           ) {
            *cursorBlockNeedingRepaint = previousBlock;
        }

        previousBlock = it.currentBlock();
        previousFrame = c;
    }

    for (int i = 0; i < floats.size(); ++i) {
        QTextFrame *frame = floats.at(i);
        if (!isFrameFromInlineObject(frame)
            || frame->frameFormat().position() == QTextFrameFormat::InFlow)
            continue;

        const int pos = frame->firstPosition() - 1;
        QTextCharFormat format = const_cast<QTextDocumentLayout *>(q)->format(pos);
        QTextObjectInterface *handler = q->handlerForObject(format.objectType());
        if (handler) {
            QRectF rect = frameBoundingRectInternal(frame);
            handler->drawObject(painter, rect, document, pos, format);
        }
    }
}